

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

optional<bool>
anon_unknown.dwarf_14f13::AdjustRPathELF
          (string *file,EmptyCallback *emptyCallback,AdjustCallback *adjustCallback,string *emsg,
          bool *changed)

{
  string *__s;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  StringEntry *pSVar5;
  StringEntry *pSVar6;
  unsigned_long uVar7;
  long *plVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  ushort uVar11;
  ulong uVar12;
  uint uVar13;
  ushort uVar14;
  ulong uVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  outRPath;
  StringEntry *se [2];
  cmELF elf;
  char *se_name [2];
  ofstream f;
  cmSystemToolsRPathInfo rp [2];
  undefined1 local_388 [32];
  string *local_368;
  ulong local_360;
  cmAlphaNum local_358;
  StringEntry *local_328 [2];
  cmAlphaNum local_318;
  char *local_2e8 [2];
  undefined1 local_2d8 [8];
  char *local_2d0;
  size_t local_2c8;
  string *local_2c0;
  byte local_2b8 [8];
  char *local_2b0;
  ios_base local_1e0 [264];
  undefined1 local_d8 [48];
  ulong local_a8 [12];
  long local_48 [3];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar4 = 0xa0;
  puVar10 = local_d8 + 0x20;
  do {
    *(undefined1 **)(puVar10 + -0x10) = puVar10;
    *(undefined8 *)(puVar10 + -8) = 0;
    *puVar10 = 0;
    *(undefined1 **)(puVar10 + 0x10) = puVar10 + 0x20;
    *(undefined8 *)(puVar10 + 0x18) = 0;
    puVar10[0x20] = 0;
    puVar10 = puVar10 + 0x50;
    lVar4 = lVar4 + -0x50;
  } while (lVar4 != 0);
  cmELF::cmELF((cmELF *)&local_318,(file->_M_dataplus)._M_p);
  bVar2 = cmELF::Valid((cmELF *)&local_318);
  if (!bVar2) {
    cmELF::~cmELF((cmELF *)&local_318);
    uVar11 = 0;
    uVar14 = 0;
    goto LAB_00118f23;
  }
  local_328[0] = (StringEntry *)0x0;
  local_328[1] = (StringEntry *)0x0;
  local_2e8[0] = (char *)0x0;
  local_2e8[1] = (char *)0x0;
  pSVar5 = cmELF::GetRPath((cmELF *)&local_318);
  if (pSVar5 != (StringEntry *)0x0) {
    local_2e8[0] = "RPATH";
    local_328[0] = pSVar5;
  }
  uVar13 = (uint)(pSVar5 != (StringEntry *)0x0);
  pSVar6 = cmELF::GetRunPath((cmELF *)&local_318);
  if (pSVar6 == (StringEntry *)0x0) {
    local_360 = 1;
    if (pSVar5 != (StringEntry *)0x0) goto LAB_00118ba7;
    local_2d8 = (undefined1  [8])emsg;
    if ((emptyCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00119170:
      uVar9 = std::__throw_bad_function_call();
      std::ofstream::~ofstream(local_2d8);
      lVar4 = 0x50;
      do {
        cmSystemToolsRPathInfo::~cmSystemToolsRPathInfo
                  ((cmSystemToolsRPathInfo *)(local_d8 + lVar4));
        lVar4 = lVar4 + -0x50;
      } while (lVar4 != -0x50);
      _Unwind_Resume(uVar9);
    }
    bVar2 = (*emptyCallback->_M_invoker)
                      ((_Any_data *)emptyCallback,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       local_2d8,(cmELF *)&local_318);
    uVar11 = (ushort)bVar2;
    cmELF::~cmELF((cmELF *)&local_318);
  }
  else {
    uVar15 = (ulong)(uVar13 * 8);
    *(StringEntry **)((long)local_328 + uVar15) = pSVar6;
    *(char **)((long)local_2e8 + uVar15) = "RUNPATH";
    local_360 = (ulong)(uVar13 + 1);
LAB_00118ba7:
    bVar2 = true;
    uVar15 = 0;
    uVar13 = 0;
    local_368 = file;
    do {
      if (uVar13 == 0) {
        pSVar5 = local_328[uVar15];
        uVar7 = pSVar5->Position;
LAB_00118bee:
        lVar4 = (long)(int)uVar13 * 0x50;
        *(unsigned_long *)(local_d8 + lVar4) = uVar7;
        *(unsigned_long *)(local_d8 + lVar4 + 8) = pSVar5->Size;
        __s = (string *)local_2e8[uVar15];
        pcVar1 = *(char **)(local_d8 + lVar4 + 0x18);
        strlen((char *)__s);
        std::__cxx11::string::_M_replace((ulong)(local_d8 + lVar4 + 0x10),0,pcVar1,(ulong)__s);
        local_358.Digits_[0x10] = '\0';
        local_388._0_8_ = emsg;
        local_2d8 = (undefined1  [8])__s;
        if ((adjustCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
          goto LAB_00119170;
        }
        bVar3 = (*adjustCallback->_M_invoker)
                          ((_Any_data *)adjustCallback,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_358,&pSVar5->Value,(char **)local_2d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           local_388);
        if (bVar3) {
          bVar3 = true;
          if (local_358.Digits_[0x10] == '\x01') {
            bVar2 = (bool)(bVar2 & local_358.View_._M_str == (char *)0x0);
            if (*(char **)(local_d8 + lVar4 + 8) < local_358.View_._M_str + 1) {
              if (emsg == (string *)0x0) {
                bVar3 = false;
              }
              else {
                local_2c8 = strlen((char *)__s);
                local_2d8 = (undefined1  [8])0x29;
                local_2d0 = "The replacement path is too long for the ";
                local_2b8[0] = 7;
                local_2b8[1] = 0;
                local_2b8[2] = 0;
                local_2b8[3] = 0;
                local_2b8[4] = 0;
                local_2b8[5] = 0;
                local_2b8[6] = 0;
                local_2b8[7] = 0;
                local_2b0 = " entry.";
                views._M_len = 3;
                views._M_array = (iterator)local_2d8;
                local_2c0 = __s;
                cmCatViews_abi_cxx11_((string *)local_388,views);
                std::__cxx11::string::operator=((string *)emsg,(string *)local_388);
                if ((string *)local_388._0_8_ != (string *)(local_388 + 0x10)) {
                  operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                }
                bVar3 = false;
              }
            }
            else {
              std::__cxx11::string::operator=
                        ((string *)(local_a8 + (long)(int)uVar13 * 10),(string *)&local_358);
              uVar13 = uVar13 + 1;
            }
          }
          else {
            bVar2 = false;
          }
        }
        else {
          bVar3 = false;
        }
        if ((local_358.Digits_[0x10] == '\x01') &&
           (local_358.Digits_[0x10] = '\0', (char *)local_358.View_._M_len != local_358.Digits_)) {
          operator_delete((void *)local_358.View_._M_len,local_358.Digits_._0_8_ + 1);
        }
        if (!bVar3) {
          cmELF::~cmELF((cmELF *)&local_318);
          goto LAB_00118edd;
        }
      }
      else {
        pSVar5 = local_328[uVar15];
        uVar7 = pSVar5->Position;
        if (local_d8._0_8_ != uVar7) goto LAB_00118bee;
      }
      uVar15 = uVar15 + 1;
    } while (local_360 != uVar15);
    cmELF::~cmELF((cmELF *)&local_318);
    uVar14 = 0x100;
    uVar11 = 1;
    if (uVar13 == 0) goto LAB_00118f23;
    if (bVar2) {
      bVar2 = cmSystemTools::RemoveRPath(local_368,emsg,changed);
      uVar11 = (ushort)bVar2;
      goto LAB_00118f23;
    }
    std::ofstream::ofstream(local_2d8,(local_368->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
    if ((local_2b8[((string *)((long)local_2d8 + -0x20))->_M_string_length] & 5) != 0) {
      if (emsg != (string *)0x0) {
        std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x25dd93);
      }
LAB_00118ea5:
      local_2d8 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_2d8 + _VTT[-1]._M_string_length) = _vtable;
      std::filebuf::~filebuf((filebuf *)&local_2d0);
      std::ios_base::~ios_base(local_1e0);
LAB_00118edd:
      uVar14 = 0x100;
      uVar11 = 0;
      goto LAB_00118f23;
    }
    if (0 < (int)uVar13) {
      uVar15 = 0;
      do {
        lVar4 = uVar15 * 0x50;
        plVar8 = (long *)std::ostream::seekp((ostream *)local_2d8,*(undefined8 *)(local_d8 + lVar4),
                                             0);
        if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
          if (emsg != (string *)0x0) {
            local_318.View_._M_len = 0x11;
            local_318.View_._M_str = "Error seeking to ";
            local_358.View_._M_str = *(char **)(local_d8 + lVar4 + 0x10);
            local_358.View_._M_len = *(size_t *)(local_d8 + lVar4 + 0x18);
            cmStrCat<char[11]>((string *)local_388,&local_318,&local_358,(char (*) [11])0x25def1);
LAB_00119136:
            std::__cxx11::string::operator=((string *)emsg,(string *)local_388);
            if ((string *)local_388._0_8_ != (string *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            }
          }
          goto LAB_00118ea5;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2d8,(char *)local_a8[uVar15 * 10],local_a8[uVar15 * 10 + 1]);
        for (uVar12 = local_a8[uVar15 * 10 + 1]; uVar12 < *(ulong *)(local_d8 + lVar4 + 8);
            uVar12 = uVar12 + 1) {
          local_318.View_._M_len = local_318.View_._M_len & 0xffffffffffffff00;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2d8,(char *)&local_318,1);
        }
        if ((local_2b8[((string *)((long)local_2d8 + -0x20))->_M_string_length] & 5) != 0) {
          if (emsg != (string *)0x0) {
            local_318.View_._M_len = 0x16;
            local_318.View_._M_str = "Error writing the new ";
            local_358.View_._M_str = *(char **)(local_d8 + lVar4 + 0x10);
            local_358.View_._M_len = *(size_t *)(local_d8 + lVar4 + 0x18);
            cmStrCat<char[21]>((string *)local_388,&local_318,&local_358,(char (*) [21])0x25df19);
            goto LAB_00119136;
          }
          goto LAB_00118ea5;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar13);
    }
    local_2d8 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_2d8 + _VTT[-1]._M_string_length) = _vtable;
    std::filebuf::~filebuf((filebuf *)&local_2d0);
    std::ios_base::~ios_base(local_1e0);
    uVar11 = 1;
    if (changed != (bool *)0x0) {
      *changed = true;
    }
  }
  uVar14 = 0x100;
LAB_00118f23:
  lVar4 = -0xa0;
  plVar8 = local_48;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    if (plVar8 + -4 != (long *)plVar8[-6]) {
      operator_delete((long *)plVar8[-6],plVar8[-4] + 1);
    }
    plVar8 = plVar8 + -10;
    lVar4 = lVar4 + 0x50;
  } while (lVar4 != 0);
  return (_Optional_base<bool,_true,_true>)(uVar14 | uVar11);
}

Assistant:

cm::optional<bool> AdjustRPathELF(std::string const& file,
                                  const EmptyCallback& emptyCallback,
                                  const AdjustCallback& adjustCallback,
                                  std::string* emsg, bool* changed)
{
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());
    if (!elf) {
      return cm::nullopt; // Not a valid ELF file.
    }

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    const char* se_name[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      return emptyCallback(emsg, elf);
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      // Adjust the rpath.
      cm::optional<std::string> outRPath;
      if (!adjustCallback(outRPath, se[i]->Value, se_name[i], emsg)) {
        return false;
      }

      if (outRPath) {
        if (!outRPath->empty()) {
          remove_rpath = false;
        }

        // Make sure there is enough room to store the new rpath and at
        // least one null terminator.
        if (rp[rp_count].Size < outRPath->length() + 1) {
          if (emsg) {
            *emsg = cmStrCat("The replacement path is too long for the ",
                             se_name[i], " entry.");
          }
          return false;
        }

        // This entry is ready for update.
        rp[rp_count].Value = std::move(*outRPath);
        ++rp_count;
      } else {
        remove_rpath = false;
      }
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = cmStrCat("Error seeking to ", rp[i].Name, " position.");
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = cmStrCat("Error writing the new ", rp[i].Name,
                           " string to the file.");
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
}